

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  LogMessage *pLVar1;
  undefined7 in_register_00000011;
  LogFinisher local_69;
  ExtensionInfo info;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    LogMessage::LogMessage
              ((LogMessage *)&info,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9c);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)&info,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ")
    ;
    LogFinisher::operator=(&local_69,pLVar1);
  }
  else if (type == '\v') {
    LogMessage::LogMessage
              ((LogMessage *)&info,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9d);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)&info,
                        "CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=(&local_69,pLVar1);
  }
  else {
    if (type != '\n') goto LAB_003be07f;
    LogMessage::LogMessage
              ((LogMessage *)&info,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9e);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)&info,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): "
                       );
    LogFinisher::operator=(&local_69,pLVar1);
  }
  LogMessage::~LogMessage((LogMessage *)&info);
LAB_003be07f:
  info.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  info.field_5.enum_validity_check.arg = (void *)0x0;
  info.descriptor = (FieldDescriptor *)0x0;
  info.message = extendee;
  info.number = number;
  info.type = type;
  info.is_repeated = is_repeated;
  info.is_packed = is_packed;
  anon_unknown_26::Register(&info);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}